

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject.cc
# Opt level: O0

string * __thiscall
QPDFObject::getDescription_abi_cxx11_(string *__return_storage_ptr__,QPDFObject *this)

{
  bool bVar1;
  qpdf_object_type_e qVar2;
  element_type *peVar3;
  char *pcVar4;
  variant_alternative_t<0UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  *pvVar5;
  variant_alternative_t<1UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  *pvVar6;
  element_type *__lhs;
  ulong uVar7;
  variant_alternative_t<2UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  *pvVar8;
  element_type *this_00;
  variant_alternative_t<3UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  *pvVar9;
  int __c;
  QPDFObject *__s;
  uint local_304;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  byte local_1c3;
  allocator<char> local_1c2;
  undefined1 local_1c1;
  variant_alternative_t<3UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  local_1c0;
  int stream_id;
  size_type pos_2;
  undefined1 local_190 [8];
  shared_ptr<QPDFObject> p;
  undefined1 local_178 [8];
  variant_alternative_t<2UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  j_descr_1;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  variant_alternative_t<1UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  j_descr;
  size_type pos_1;
  string local_50;
  ulong local_30;
  size_type pos;
  long local_20;
  qpdf_offset_t shift;
  QPDFObject *this_local;
  string *result;
  
  __s = this;
  shift = (qpdf_offset_t)this;
  this_local = (QPDFObject *)__return_storage_ptr__;
  qVar2 = getTypeCode(this);
  if (qVar2 == ot_dictionary) {
    local_304 = 2;
  }
  else {
    qVar2 = getTypeCode(this);
    local_304 = (uint)(qVar2 == ot_array);
  }
  local_20 = (long)(int)local_304;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->object_description);
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->object_description);
    pcVar4 = std::
             variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
             ::index(peVar3,(char *)__s,__c);
    switch(pcVar4) {
    case (char *)0x0:
      pos._7_1_ = 0;
      peVar3 = std::
               __shared_ptr_access<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->object_description);
      pvVar5 = std::
               get<0ul,std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>
                         (peVar3);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar5);
      uVar7 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x42bb94);
      local_30 = uVar7;
      if (uVar7 != 0xffffffffffffffff) {
        QPDFObjGen::unparse_abi_cxx11_(&local_50,&this->og,' ');
        std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar7,(string *)0x3);
        std::__cxx11::string::~string((string *)&local_50);
      }
      uVar7 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x42cd81);
      if (uVar7 != 0xffffffffffffffff) {
        std::__cxx11::to_string
                  ((string *)((long)&j_descr.object.field_2 + 8),this->parsed_offset + local_20);
        std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar7,(string *)0x3);
        std::__cxx11::string::~string((string *)(j_descr.object.field_2._M_local_buf + 8));
      }
      break;
    case (char *)0x1:
      peVar3 = std::
               __shared_ptr_access<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->object_description);
      pvVar6 = std::
               get<1ul,std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>
                         (peVar3);
      JSON_Descr::JSON_Descr((JSON_Descr *)local_b8,pvVar6);
      __lhs = std::
              __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_b8);
      uVar7 = std::__cxx11::string::empty();
      bVar1 = (uVar7 & 1) != 0;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_119);
      }
      else {
        std::operator+(&local_118,", ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &j_descr.input.
                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
      }
      std::operator+(&local_f8,__lhs,&local_118);
      std::operator+(&local_d8,&local_f8," at offset ");
      std::__cxx11::to_string
                ((string *)((long)&j_descr_1.var_descr.field_2 + 8),this->parsed_offset);
      std::operator+(__return_storage_ptr__,&local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&j_descr_1.var_descr.field_2 + 8));
      std::__cxx11::string::~string((string *)(j_descr_1.var_descr.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      if (bVar1) {
        std::allocator<char>::~allocator(&local_119);
      }
      JSON_Descr::~JSON_Descr((JSON_Descr *)local_b8);
      break;
    case (char *)0x2:
      peVar3 = std::
               __shared_ptr_access<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->object_description);
      pvVar8 = std::
               get<2ul,std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>
                         (peVar3);
      ChildDescr::ChildDescr((ChildDescr *)local_178,pvVar8);
      p.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::weak_ptr<QPDFObject>::lock((weak_ptr<QPDFObject> *)local_190);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_190);
      if (bVar1) {
        this_00 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_190);
        getDescription_abi_cxx11_((string *)&pos_2,this_00);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&pos_2);
        std::__cxx11::string::~string((string *)&pos_2);
      }
      std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)local_190);
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 j_descr_1.parent.super___weak_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _stream_id = std::__cxx11::string::find((char *)__return_storage_ptr__,0x4305aa);
      if (_stream_id != 0xffffffffffffffff) {
        std::__cxx11::string::replace((ulong)__return_storage_ptr__,_stream_id,(string *)0x3);
      }
      p.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
      ChildDescr::~ChildDescr((ChildDescr *)local_178);
      break;
    case (char *)0x3:
      peVar3 = std::
               __shared_ptr_access<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->object_description);
      pvVar9 = std::
               get<3ul,std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>
                         (peVar3);
      local_1c0 = *pvVar9;
      local_1c1 = 0;
      local_1c3 = 0;
      if (this->qpdf == (QPDF *)0x0) {
        std::allocator<char>::allocator();
        local_1c3 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_1c2);
      }
      else {
        QPDF::getFilename_abi_cxx11_(__return_storage_ptr__,this->qpdf);
      }
      if ((local_1c3 & 1) != 0) {
        std::allocator<char>::~allocator(&local_1c2);
      }
      std::__cxx11::to_string(&local_288,local_1c0.stream_id);
      std::operator+(&local_268," object stream ",&local_288);
      std::operator+(&local_248,&local_268,", object ");
      std::__cxx11::to_string(&local_2a8,local_1c0.obj_id);
      std::operator+(&local_228,&local_248,&local_2a8);
      std::operator+(&local_208,&local_228," 0 at offset ");
      std::__cxx11::to_string(&local_2c8,this->parsed_offset + local_20);
      std::operator+(&local_1e8,&local_208,&local_2c8);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
      break;
    default:
      goto switchD_002bad6d_default;
    }
  }
  else {
    bVar1 = QPDFObjGen::isIndirect(&this->og);
    if (bVar1) {
      QPDFObjGen::unparse_abi_cxx11_(&local_2e8,&this->og,' ');
      std::operator+(__return_storage_ptr__,"object ",&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      return __return_storage_ptr__;
    }
switchD_002bad6d_default:
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFObject::getDescription()
{
    qpdf_offset_t shift = (getTypeCode() == ::ot_dictionary) ? 2
        : (getTypeCode() == ::ot_array)                      ? 1
                                                             : 0;

    if (object_description) {
        switch (object_description->index()) {
        case 0:
            {
                // Simple template string
                auto description = std::get<0>(*object_description);

                if (auto pos = description.find("$OG"); pos != std::string::npos) {
                    description.replace(pos, 3, og.unparse(' '));
                }
                if (auto pos = description.find("$PO"); pos != std::string::npos) {
                    description.replace(pos, 3, std::to_string(parsed_offset + shift));
                }
                return description;
            }
        case 1:
            {
                // QPDF::JSONReactor generated description
                auto j_descr = std::get<1>(*object_description);
                return (
                    *j_descr.input + (j_descr.object.empty() ? "" : ", " + j_descr.object) +
                    " at offset " + std::to_string(parsed_offset));
            }
        case 2:
            {
                // Child object description
                auto j_descr = std::get<2>(*object_description);
                std::string result;
                if (auto p = j_descr.parent.lock()) {
                    result = p->getDescription();
                }
                result += j_descr.static_descr;
                if (auto pos = result.find("$VD"); pos != std::string::npos) {
                    result.replace(pos, 3, j_descr.var_descr);
                }
                return result;
            }
        case 3:
            auto [stream_id, obj_id] = std::get<3>(*object_description);
            std::string result = qpdf ? qpdf->getFilename() : "";
            result += " object stream " + std::to_string(stream_id) + ", object " +
                std::to_string(obj_id) + " 0 at offset " + std::to_string(parsed_offset + shift);
            return result;
        }

    } else if (og.isIndirect()) {
        return "object " + og.unparse(' ');
    }
    return {};
}